

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsLinear(ON_Xform *this)

{
  double *pdVar1;
  bool bVar2;
  bool local_11;
  ON_Xform *this_local;
  
  bVar2 = IsAffine(this);
  local_11 = false;
  if (bVar2) {
    pdVar1 = this->m_xform[0] + 3;
    local_11 = false;
    if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
      pdVar1 = this->m_xform[1] + 3;
      local_11 = false;
      if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
        local_11 = this->m_xform[2][3] == 0.0;
      }
    }
  }
  return local_11;
}

Assistant:

bool ON_Xform::IsLinear() const
{
	return (IsAffine() 
		&& 0.0 == m_xform[0][3]
		&& 0.0 == m_xform[1][3]
		&& 0.0 == m_xform[2][3]);
}